

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGenerator::GetFrameworkFlags
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *l,string *config,
          cmGeneratorTarget *target)

{
  cmGeneratorTarget *target_local;
  string *config_local;
  string *l_local;
  cmLocalGenerator *this_local;
  
  ::GetFrameworkFlags(__return_storage_ptr__,l,config,target);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetFrameworkFlags(std::string const& l,
                                                std::string const& config,
                                                cmGeneratorTarget* target)
{
  return ::GetFrameworkFlags(l, config, target);
}